

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SzArEx_Extract(CSzArEx *p,ILookInStream *inStream,UInt32 fileIndex,UInt32 *blockIndex,
                   Byte **tempBuf,size_t *outBufferSize,size_t *offset,size_t *outSizeProcessed,
                   ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  uint folderIndex_00;
  UInt32 UVar1;
  UInt64 UVar2;
  Byte *pBVar3;
  UInt64 unpackPos;
  size_t unpackSize;
  UInt64 unpackSizeSpec;
  SRes res;
  UInt32 folderIndex;
  size_t *outBufferSize_local;
  Byte **tempBuf_local;
  UInt32 *blockIndex_local;
  UInt32 fileIndex_local;
  ILookInStream *inStream_local;
  CSzArEx *p_local;
  
  folderIndex_00 = p->FileToFolder[fileIndex];
  unpackSizeSpec._0_4_ = 0;
  *offset = 0;
  *outSizeProcessed = 0;
  if (folderIndex_00 == 0xffffffff) {
    (*allocMain->Free)(allocMain,*tempBuf);
    *blockIndex = 0xffffffff;
    *tempBuf = (Byte *)0x0;
    *outBufferSize = 0;
    p_local._4_4_ = 0;
  }
  else {
    if ((*tempBuf == (Byte *)0x0) || (*blockIndex != folderIndex_00)) {
      UVar2 = SzAr_GetFolderUnpackSize(&p->db,folderIndex_00);
      *blockIndex = folderIndex_00;
      (*allocMain->Free)(allocMain,*tempBuf);
      *tempBuf = (Byte *)0x0;
      *outBufferSize = UVar2;
      if (UVar2 != 0) {
        pBVar3 = (Byte *)(*allocMain->Alloc)(allocMain,UVar2);
        *tempBuf = pBVar3;
        if (*tempBuf == (Byte *)0x0) {
          unpackSizeSpec._0_4_ = 2;
        }
      }
      if ((SRes)unpackSizeSpec == 0) {
        unpackSizeSpec._0_4_ =
             SzAr_DecodeFolder(&p->db,folderIndex_00,inStream,p->dataPos,*tempBuf,UVar2,allocTemp);
      }
    }
    if ((SRes)unpackSizeSpec == 0) {
      UVar2 = p->UnpackPositions[fileIndex];
      *offset = UVar2 - p->UnpackPositions[p->FolderToFile[folderIndex_00]];
      *outSizeProcessed = p->UnpackPositions[fileIndex + 1] - UVar2;
      if (*outBufferSize < *offset + *outSizeProcessed) {
        return 0xb;
      }
      if ((((p->CRCs).Defs != (Byte *)0x0) &&
          (((uint)(p->CRCs).Defs[fileIndex >> 3] & 0x80 >> ((byte)fileIndex & 7)) != 0)) &&
         (UVar1 = CrcCalc(*tempBuf + *offset,*outSizeProcessed), UVar1 != (p->CRCs).Vals[fileIndex])
         ) {
        unpackSizeSpec._0_4_ = 3;
      }
    }
    p_local._4_4_ = (SRes)unpackSizeSpec;
  }
  return p_local._4_4_;
}

Assistant:

static SRes SzArEx_Extract(
    const CSzArEx *p,
    ILookInStream *inStream,
    UInt32 fileIndex,
    UInt32 *blockIndex,
    Byte **tempBuf,
    size_t *outBufferSize,
    size_t *offset,
    size_t *outSizeProcessed,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp)
{
  UInt32 folderIndex = p->FileToFolder[fileIndex];
  SRes res = SZ_OK;
  
  *offset = 0;
  *outSizeProcessed = 0;
  
  if (folderIndex == (UInt32)-1)
  {
    IAlloc_Free(allocMain, *tempBuf);
    *blockIndex = folderIndex;
    *tempBuf = NULL;
    *outBufferSize = 0;
    return SZ_OK;
  }

  if (*tempBuf == NULL || *blockIndex != folderIndex)
  {
    UInt64 unpackSizeSpec = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
    /*
    UInt64 unpackSizeSpec =
        p->UnpackPositions[p->FolderToFile[folderIndex + 1]] -
        p->UnpackPositions[p->FolderToFile[folderIndex]];
    */
    size_t unpackSize = (size_t)unpackSizeSpec;

    if (unpackSize != unpackSizeSpec)
      return SZ_ERROR_MEM;
    *blockIndex = folderIndex;
    IAlloc_Free(allocMain, *tempBuf);
    *tempBuf = NULL;
    
    if (res == SZ_OK)
    {
      *outBufferSize = unpackSize;
      if (unpackSize != 0)
      {
        *tempBuf = (Byte *)IAlloc_Alloc(allocMain, unpackSize);
        if (*tempBuf == NULL)
          res = SZ_ERROR_MEM;
      }
  
      if (res == SZ_OK)
      {
        res = SzAr_DecodeFolder(&p->db, folderIndex,
            inStream, p->dataPos, *tempBuf, unpackSize, allocTemp);
      }
    }
  }

  if (res == SZ_OK)
  {
    UInt64 unpackPos = p->UnpackPositions[fileIndex];
    *offset = (size_t)(unpackPos - p->UnpackPositions[p->FolderToFile[folderIndex]]);
    *outSizeProcessed = (size_t)(p->UnpackPositions[fileIndex + 1] - unpackPos);
    if (*offset + *outSizeProcessed > *outBufferSize)
      return SZ_ERROR_FAIL;
    if (SzBitWithVals_Check(&p->CRCs, fileIndex))
      if (CrcCalc(*tempBuf + *offset, *outSizeProcessed) != p->CRCs.Vals[fileIndex])
        res = SZ_ERROR_CRC;
  }

  return res;
}